

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint32 local_50;
  ushort local_4a;
  uint32 indexVal;
  PropertyIndex index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyOperationFlags flags_local;
  Var value_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local._4_4_ = flags;
  pvStack_30 = value;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  _indexVal = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(value_local._4_4_,_indexVal);
  BVar3 = GetDescriptor(this,value_local._4_4_,&local_4a);
  if (BVar3 == 0) {
    BVar3 = ScriptContext::IsNumericPropertyId(_indexVal,value_local._4_4_,&local_50);
    if (BVar3 == 0) {
      this_local._4_4_ =
           AddProperty(this,pDStack_20,value_local._4_4_,pvStack_30,'\a',
                       (PropertyValueInfo *)scriptContext,info_local._4_4_,SideEffects_Any);
    }
    else {
      this_local._4_4_ =
           DynamicTypeHandler::SetItem
                     (&this->super_DynamicTypeHandler,pDStack_20,local_50,pvStack_30,
                      info_local._4_4_);
    }
  }
  else {
    if ((this->descriptors[local_4a].field_1.Attributes & 8) == 0) {
      if ((this->descriptors[local_4a].field_1.Attributes & 4) == 0) {
        JavascriptError::ThrowCantAssignIfStrictMode(info_local._4_4_,_indexVal);
        PropertyValueInfo::Set
                  ((PropertyValueInfo *)scriptContext,&pDStack_20->super_RecyclableObject,local_4a,
                   this->descriptors[local_4a].field_1.Attributes,InlineCacheNoFlags);
        return 0;
      }
    }
    else {
      bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x23a,"(!GetIsLocked())","!GetIsLocked()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this->descriptors[local_4a].field_1.Attributes = '\a';
      DynamicObject::SetHasNoEnumerableProperties(pDStack_20,false);
    }
    DynamicTypeHandler::SetSlotUnchecked(pDStack_20,(uint)local_4a,pvStack_30);
    PropertyValueInfo::Set
              ((PropertyValueInfo *)scriptContext,&pDStack_20->super_RecyclableObject,local_4a,
               this->descriptors[local_4a].field_1.Attributes,InlineCacheNoFlags);
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDStack_20,value_local._4_4_,pvStack_30,
               SideEffects_Any);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, scriptContext);

        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                descriptors[index].Attributes = PropertyDynamicTypeDefaults;
                instance->SetHasNoEnumerableProperties(false);
            }
            else if (!(descriptors[index].Attributes & PropertyWritable))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes); // Try to cache property info even if not writable
                return false;
            }

            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
            return true;
        }

        // Always check numeric propertyId. This may create objectArray.
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItem(instance, indexVal, value, flags);
        }

        return this->AddProperty(instance, propertyId, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }